

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

int sndio_stream_init(cubeb_conflict2 *context,cubeb_stream_conflict2 **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict2 data_callback,
                     cubeb_state_callback_conflict2 state_callback,void *user_ptr)

{
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var1;
  int iVar2;
  char *pcVar3;
  sio_hdl *psVar4;
  undefined8 *__dest;
  void *pvVar5;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int *in_stack_00000008;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  size_t bps;
  int rate;
  cubeb_sample_format format;
  sio_par rpar;
  sio_par wpar;
  cubeb_stream_conflict2 *s;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  ulong local_d0;
  uint local_c8;
  int local_c4;
  sio_par local_c0;
  sio_par local_80;
  undefined8 *local_40;
  int *local_30;
  undefined8 *local_18;
  undefined8 local_10;
  
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = (undefined8 *)malloc(0xa8);
  if (local_40 == (undefined8 *)0x0) {
    return -1;
  }
  memset(local_40,0,0xa8);
  *(undefined4 *)(local_40 + 9) = 0;
  if (local_30 != (int *)0x0) {
    if ((local_30[4] & 1U) != 0) goto LAB_00141c00;
    *(uint *)(local_40 + 9) = *(uint *)(local_40 + 9) | 2;
    local_c4 = *local_30;
    local_c8 = local_30[1];
  }
  if (in_stack_00000008 != (int *)0x0) {
    if ((in_stack_00000008[4] & 1U) != 0) goto LAB_00141c00;
    *(uint *)(local_40 + 9) = *(uint *)(local_40 + 9) | 1;
    local_c4 = *in_stack_00000008;
    local_c8 = in_stack_00000008[1];
  }
  if (*(int *)(local_40 + 9) != 0) {
    *local_40 = local_10;
    p_Var1 = cubeb_sio_open;
    pcVar3 = sndio_get_device();
    psVar4 = (*p_Var1)(pcVar3,*(uint *)(local_40 + 9),1);
    local_40[8] = psVar4;
    if (local_40[8] != 0) {
      (*cubeb_sio_initpar)(&local_80);
      local_80.sig = 1;
      local_80.bits = 0x10;
      if (local_c4 == 0) {
        local_80.le = 1;
      }
      else if (local_c4 == 1) {
        local_80.le = 0;
      }
      else {
        if (local_c4 != 2) goto LAB_00141c00;
        local_80.le = 1;
      }
      local_80.rate = local_c8;
      if ((*(uint *)(local_40 + 9) & 2) != 0) {
        local_80.rchan = local_30[2];
      }
      if ((*(uint *)(local_40 + 9) & 1) != 0) {
        local_80.pchan = in_stack_00000008[2];
      }
      iVar2 = (*cubeb_sio_setpar)((sio_hdl *)local_40[8],&local_80);
      if ((((((iVar2 != 0) &&
             (iVar2 = (*cubeb_sio_getpar)((sio_hdl *)local_40[8],&local_c0), iVar2 != 0)) &&
            (local_c0.bits == local_80.bits)) &&
           ((local_c0.le == local_80.le && (local_c0.sig == local_80.sig)))) &&
          ((local_c0.rate == local_80.rate &&
           (((*(uint *)(local_40 + 9) & 2) == 0 || (local_c0.rchan == local_80.rchan)))))) &&
         (((*(uint *)(local_40 + 9) & 1) == 0 || (local_c0.pchan == local_80.pchan)))) {
        (*cubeb_sio_onmove)((sio_hdl *)local_40[8],sndio_onmove,local_40);
        *(undefined4 *)((long)local_40 + 0x4c) = 0;
        *(uint *)(local_40 + 0xd) = local_c0.round;
        *(uint *)((long)local_40 + 0x6c) = local_c0.bps * local_c0.rchan;
        *(uint *)(local_40 + 0xe) = local_c0.bps * local_c0.pchan;
        *(uint *)((long)local_40 + 0x74) = local_c0.rchan;
        *(uint *)(local_40 + 0xf) = local_c0.pchan;
        *(uint *)((long)local_40 + 0x7c) = local_c0.bufsz / local_c0.round;
        local_40[0x12] = in_stack_00000018;
        local_40[0x13] = in_stack_00000020;
        local_40[1] = in_stack_00000028;
        __dest = local_40 + 3;
        memset(local_f8,0,0x28);
        local_e8 = 0;
        memcpy(__dest,local_f8,0x28);
        local_40[0x11] = 0;
        local_40[0x10] = 0;
        if (local_c4 == 2) {
          *(undefined4 *)(local_40 + 10) = 1;
          local_d0 = 4;
        }
        else {
          *(undefined4 *)(local_40 + 10) = 0;
          local_d0 = (ulong)local_c0.bps;
        }
        if ((*(uint *)(local_40 + 9) & 1) != 0) {
          pvVar5 = malloc(local_d0 * local_c0.pchan * (ulong)local_c0.round);
          local_40[0xc] = pvVar5;
          if (local_40[0xc] == 0) goto LAB_00141c00;
        }
        if ((*(uint *)(local_40 + 9) & 2) != 0) {
          pvVar5 = malloc(local_d0 * local_c0.rchan * (ulong)local_c0.round);
          local_40[0xb] = pvVar5;
          if (local_40[0xb] == 0) goto LAB_00141c00;
        }
        *(undefined4 *)(local_40 + 0x14) = 0x3f800000;
        *local_18 = local_40;
        return 0;
      }
    }
  }
LAB_00141c00:
  if (local_40[8] != 0) {
    (*cubeb_sio_close)((sio_hdl *)local_40[8]);
  }
  if (local_40[0xc] != 0) {
    free((void *)local_40[0xc]);
  }
  if (local_40[0xb] != 0) {
    free((void *)local_40[0xc]);
  }
  free(local_40);
  return -1;
}

Assistant:

static int
sndio_stream_init(cubeb * context,
                  cubeb_stream ** stream,
                  char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void *user_ptr)
{
  cubeb_stream *s;
  struct sio_par wpar, rpar;
  cubeb_sample_format format;
  int rate;
  size_t bps;

  DPR("sndio_stream_init(%s)\n", stream_name);

  s = malloc(sizeof(cubeb_stream));
  if (s == NULL)
    return CUBEB_ERROR;
  memset(s, 0, sizeof(cubeb_stream));
  s->mode = 0;
  if (input_stream_params) {
    if (input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_REC;
    format = input_stream_params->format;
    rate = input_stream_params->rate;
  }
  if (output_stream_params) {
    if (output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_PLAY;
    format = output_stream_params->format;
    rate = output_stream_params->rate;
  }
  if (s->mode == 0) {
    DPR("sndio_stream_init(), neither playing nor recording\n");
    goto err;
  }
  s->context = context;
  s->hdl = WRAP(sio_open)(sndio_get_device(), s->mode, 1);
  if (s->hdl == NULL) {
    DPR("sndio_stream_init(), sio_open() failed\n");
    goto err;
  }
  WRAP(sio_initpar)(&wpar);
  wpar.sig = 1;
  wpar.bits = 16;
  switch (format) {
  case CUBEB_SAMPLE_S16LE:
    wpar.le = 1;
    break;
  case CUBEB_SAMPLE_S16BE:
    wpar.le = 0;
    break;
  case CUBEB_SAMPLE_FLOAT32NE:
    wpar.le = SIO_LE_NATIVE;
    break;
  default:
    DPR("sndio_stream_init() unsupported format\n");
    goto err;
  }
  wpar.rate = rate;
  if (s->mode & SIO_REC)
    wpar.rchan = input_stream_params->channels;
  if (s->mode & SIO_PLAY)
    wpar.pchan = output_stream_params->channels;
  wpar.appbufsz = latency_frames;
  if (!WRAP(sio_setpar)(s->hdl, &wpar) || !WRAP(sio_getpar)(s->hdl, &rpar)) {
    DPR("sndio_stream_init(), sio_setpar() failed\n");
    goto err;
  }
  if (rpar.bits != wpar.bits || rpar.le != wpar.le ||
      rpar.sig != wpar.sig || rpar.rate != wpar.rate ||
      ((s->mode & SIO_REC) && rpar.rchan != wpar.rchan) ||
      ((s->mode & SIO_PLAY) && rpar.pchan != wpar.pchan)) {
    DPR("sndio_stream_init() unsupported params\n");
    goto err;
  }
  WRAP(sio_onmove)(s->hdl, sndio_onmove, s);
  s->active = 0;
  s->nfr = rpar.round;
  s->rbpf = rpar.bps * rpar.rchan;
  s->pbpf = rpar.bps * rpar.pchan;
  s->rchan = rpar.rchan;
  s->pchan = rpar.pchan;
  s->nblks = rpar.bufsz / rpar.round;
  s->data_cb = data_callback;
  s->state_cb = state_callback;
  s->arg = user_ptr;
  s->mtx = (pthread_mutex_t)PTHREAD_MUTEX_INITIALIZER;
  s->hwpos = s->swpos = 0;
  if (format == CUBEB_SAMPLE_FLOAT32LE) {
    s->conv = 1;
    bps = sizeof(float);
  } else {
    s->conv = 0;
    bps = rpar.bps;
  }
  if (s->mode & SIO_PLAY) {
    s->pbuf = malloc(bps * rpar.pchan * rpar.round);
    if (s->pbuf == NULL)
      goto err;
  }
  if (s->mode & SIO_REC) {
    s->rbuf = malloc(bps * rpar.rchan * rpar.round);
    if (s->rbuf == NULL)
      goto err;
  }
  s->volume = 1.;
  *stream = s;
  DPR("sndio_stream_init() end, ok\n");
  (void)context;
  (void)stream_name;
  return CUBEB_OK;
err:
  if (s->hdl)
    WRAP(sio_close)(s->hdl);
  if (s->pbuf)
    free(s->pbuf);
  if (s->rbuf)
    free(s->pbuf);
  free(s);
  return CUBEB_ERROR;
}